

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_aggregate_states.cpp
# Opt level: O1

void __thiscall duckdb::WindowAggregateStates::Initialize(WindowAggregateStates *this,idx_t count)

{
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *this_00;
  _Head_base<0UL,_duckdb::Vector_*,_false> __ptr;
  data_ptr_t pdVar1;
  _Head_base<0UL,_duckdb::Vector_*,_false> _Var2;
  Vector *this_01;
  type pVVar3;
  pointer this_02;
  idx_t iVar4;
  pointer puVar5;
  _Head_base<0UL,_duckdb::Vector_*,_false> local_50;
  LogicalType local_48;
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&(this->states).super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
             this->state_size * count);
  puVar5 = (this->states).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  this_01 = (Vector *)operator_new(0x68);
  LogicalType::LogicalType(&local_48,POINTER);
  Vector::Vector(this_01,&local_48,count);
  local_50._M_head_impl = this_01;
  LogicalType::~LogicalType(&local_48);
  _Var2._M_head_impl = local_50._M_head_impl;
  this_00 = &this->statef;
  local_50._M_head_impl = (Vector *)0x0;
  __ptr._M_head_impl =
       (this->statef).super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
       super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
       super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl;
  (this->statef).super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
  super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
  super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (__ptr._M_head_impl != (Vector *)0x0) {
    ::std::default_delete<duckdb::Vector>::operator()
              ((default_delete<duckdb::Vector> *)this_00,__ptr._M_head_impl);
  }
  if (local_50._M_head_impl != (Vector *)0x0) {
    ::std::default_delete<duckdb::Vector>::operator()
              ((default_delete<duckdb::Vector> *)&local_50,local_50._M_head_impl);
  }
  pVVar3 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this_00)
  ;
  if (count != 0) {
    pdVar1 = pVVar3->data;
    iVar4 = 0;
    do {
      *(pointer *)(pdVar1 + iVar4 * 8) = puVar5;
      (*(this->aggr).function.initialize)((AggregateFunction *)this,puVar5);
      iVar4 = iVar4 + 1;
      puVar5 = puVar5 + this->state_size;
    } while (count != iVar4);
  }
  this_02 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                      (this_00);
  Vector::SetVectorType(this_02,FLAT_VECTOR);
  return;
}

Assistant:

void WindowAggregateStates::Initialize(idx_t count) {
	// Don't leak - every Initialize must be matched with a Destroy
	D_ASSERT(states.empty());

	states.resize(count * state_size);
	auto state_ptr = states.data();

	statef = make_uniq<Vector>(LogicalType::POINTER, count);
	auto state_f_data = FlatVector::GetData<data_ptr_t>(*statef);

	for (idx_t i = 0; i < count; ++i, state_ptr += state_size) {
		state_f_data[i] = state_ptr;
		aggr.function.initialize(aggr.function, state_ptr);
	}

	// Prevent conversion of results to constants
	statef->SetVectorType(VectorType::FLAT_VECTOR);
}